

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O2

void __thiscall
duckdb::TemporaryDirectoryHandle::~TemporaryDirectoryHandle(TemporaryDirectoryHandle *this)

{
  string *a;
  string *psVar1;
  FileSystem *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  string *b;
  bool deleted_everything;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  files_to_delete;
  char local_69;
  string *local_68;
  string *psStack_60;
  undefined8 local_58;
  undefined1 local_50 [24];
  code *local_38;
  
  ::std::
  __uniq_ptr_impl<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>_>
  ::reset((__uniq_ptr_impl<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>_>
           *)&this->temp_file,(pointer)0x0);
  this_00 = FileSystem::GetFileSystem(this->db);
  a = &this->temp_directory;
  if ((this->temp_directory)._M_string_length != 0) {
    local_58 = 0;
    local_68 = (string *)0x0;
    psStack_60 = (string *)0x0;
    if (this->created_directory == false) {
      local_50._0_8_ = &local_69;
      local_69 = '\x01';
      local_50._8_8_ = &local_68;
      local_38 = ::std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/temporary_file_manager.cpp:670:33)>
                 ::_M_invoke;
      local_50._16_8_ =
           ::std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/temporary_file_manager.cpp:670:33)>
           ::_M_manager;
      (*this_00->_vptr_FileSystem[0x10])(this_00,a,local_50,0);
      ::std::_Function_base::~_Function_base((_Function_base *)local_50);
      psVar1 = psStack_60;
      for (b = local_68; b != psVar1; b = b + 1) {
        FileSystem::JoinPath((string *)local_50,this_00,a,b);
        (*this_00->_vptr_FileSystem[0x14])(this_00,(string *)local_50,0);
        ::std::__cxx11::string::~string((string *)local_50);
      }
    }
    else {
      (*this_00->_vptr_FileSystem[0xf])(this_00,a,0);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_68);
  }
  ::std::
  unique_ptr<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>_>::
  ~unique_ptr(&(this->temp_file).
               super_unique_ptr<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>_>
             );
  ::std::__cxx11::string::~string((string *)a);
  return;
}

Assistant:

TemporaryDirectoryHandle::~TemporaryDirectoryHandle() {
	// first release any temporary files
	temp_file.reset();
	// then delete the temporary file directory
	auto &fs = FileSystem::GetFileSystem(db);
	if (!temp_directory.empty()) {
		bool delete_directory = created_directory;
		vector<string> files_to_delete;
		if (!created_directory) {
			bool deleted_everything = true;
			fs.ListFiles(temp_directory, [&](const string &path, bool isdir) {
				if (isdir) {
					deleted_everything = false;
					return;
				}
				if (!StringUtil::StartsWith(path, "duckdb_temp_")) {
					deleted_everything = false;
					return;
				}
				files_to_delete.push_back(path);
			});
		}
		if (delete_directory) {
			// we want to remove all files in the directory
			fs.RemoveDirectory(temp_directory);
		} else {
			for (auto &file : files_to_delete) {
				fs.RemoveFile(fs.JoinPath(temp_directory, file));
			}
		}
	}
}